

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vpu_api_test.c
# Opt level: O3

RK_S32 vpu_encode_demo(VpuApiDemoCmdContext_t *cmd)

{
  undefined4 uVar1;
  undefined4 uVar2;
  uint uVar3;
  uint uVar4;
  RK_U32 RVar5;
  RK_S32 RVar6;
  uint uVar7;
  FILE *__stream;
  FILE *__s;
  VpuCodecContext_t *pVVar8;
  ulong uVar9;
  undefined8 *puVar10;
  long lVar11;
  long lVar12;
  uint uVar13;
  long lVar14;
  uint uVar15;
  char *pcVar16;
  uint uVar17;
  int Format;
  undefined4 local_9c;
  undefined1 local_98 [16];
  EncInputStream_t local_88;
  undefined8 local_68;
  size_t local_58;
  EncoderOut_t local_50;
  
  local_9c = 0;
  if (cmd == (VpuApiDemoCmdContext_t *)0x0) {
    return -1;
  }
  if (((((cmd->have_input == '\0') || (cmd->width == 0)) || (cmd->height == 0)) ||
      (cmd->coding < OMX_RK_VIDEO_CodingMPEG2)) &&
     (puts("Warning: missing needed parameters for vpu api demo"), cmd->have_input == '\0')) {
    pcVar16 = "please set input bitstream file";
  }
  else {
    pcVar16 = "encode";
    if (cmd->codec_type == CODEC_DECODER) {
      pcVar16 = "decode";
    }
    printf("input bitstream w: %d, h: %d, coding: %d(%s), path: %s\n",(ulong)cmd->width,
           (ulong)cmd->height,(ulong)cmd->coding,pcVar16,cmd->input_file);
    __stream = fopen(cmd->input_file,"rb");
    if (__stream != (FILE *)0x0) {
      if (cmd->have_output == '\0') {
        __s = (FILE *)0x0;
      }
      else {
        printf("vpu api demo output file: %s\n",cmd->output_file);
        __s = fopen(cmd->output_file,"wb");
        if (__s == (FILE *)0x0) {
          puts("can not write output file");
          uVar7 = 0xffffff9b;
          __s = (FILE *)0x0;
          goto LAB_00101e8e;
        }
      }
      pVVar8 = (VpuCodecContext_t *)calloc(1,0xe0);
      ctx = pVVar8;
      if (pVVar8 == (VpuCodecContext_t *)0x0) {
        printf("Input context has not been properly allocated");
        return -1;
      }
      pVVar8->codecType = CODEC_ENCODER;
      pVVar8->videoCoding = OMX_RK_VIDEO_CodingAVC;
      RVar5 = cmd->height;
      pVVar8->width = cmd->width;
      pVVar8->height = RVar5;
      fseek(__stream,0,2);
      uVar9 = ftell(__stream);
      fseek(__stream,0,0);
      local_88.buf = (RK_U8 *)0x0;
      local_88.size = 0;
      local_88.bufPhyAddr = 0;
      local_88.timeUs = 0;
      local_88.nFlags = 0;
      local_88._28_4_ = 0;
      local_68 = 0;
      local_50._8_8_ = 0;
      local_50.timeUs = 0;
      local_50.keyFrame = 0;
      local_50._28_4_ = 0;
      local_50.data = (RK_U8 *)malloc((ulong)(cmd->height * cmd->width));
      uVar7 = 0xffffff98;
      if ((local_50.data != (RK_U8 *)0x0) &&
         (RVar6 = (*vpuapi_open_ctx)(&ctx), pVVar8 = ctx,
         ctx != (VpuCodecContext_t *)0x0 && RVar6 == 0)) {
        local_98._0_4_ = cmd->width;
        local_98._4_4_ = cmd->height;
        uVar1 = cmd->codec_type;
        uVar2 = cmd->coding;
        local_98._8_8_ = CONCAT44(uVar2,uVar1);
        pVVar8->codecType = uVar1;
        pVVar8->videoCoding = (int)((ulong)local_98._8_8_ >> 0x20);
        pVVar8->width = local_98._0_4_;
        pVVar8->height = local_98._4_4_;
        pVVar8->no_thread = 1;
        puVar10 = (undefined8 *)calloc(1,0x40);
        pVVar8->private_data = puVar10;
        *puVar10 = local_98._0_8_;
        puVar10[1] = 0x3d090000000000;
        *(undefined4 *)(puVar10 + 2) = 0x19;
        puVar10[3] = 1;
        puVar10[4] = 0x1e00000000;
        *(undefined8 *)((long)puVar10 + 0x2c) = 0x2800000064;
        uVar7 = (*pVVar8->init)(pVVar8,(RK_U8 *)0x0,0);
        if (uVar7 == 0) {
          printf("encode init ok, sps len: %d\n",(ulong)(uint)ctx->extradata_size);
          if ((__s != (FILE *)0x0) && (0 < ctx->extradata_size)) {
            printf("dump %d bytes enc output stream to file\n");
            fwrite(ctx->extradata,1,(long)ctx->extradata_size,__s);
            fflush(__s);
          }
          uVar7 = (*ctx->control)(ctx,VPU_API_ENC_SETFORMAT,&local_9c);
          if (uVar7 != 0) {
            printf("VPU_API_ENC_SETFORMAT ret %d\n",(ulong)uVar7);
          }
          uVar7 = (*ctx->control)(ctx,VPU_API_ENC_GETCFG,puVar10);
          if (uVar7 != 0) {
            printf("VPU_API_ENC_GETCFG ret %d\n",(ulong)uVar7);
          }
          *(undefined4 *)(puVar10 + 1) = 1;
          uVar7 = (*ctx->control)(ctx,VPU_API_ENC_SETCFG,puVar10);
          if (uVar7 != 0) {
            printf("VPU_API_ENC_SETCFG ret %d\n",(ulong)uVar7);
          }
          printf("init vpu api context ok, input yuv stream file size: %d\n",uVar9 & 0xffffffff);
          local_98._0_8_ = uVar9;
          uVar3 = ctx->width;
          uVar4 = ctx->height;
          uVar13 = uVar3 + 0xf & 0xfffffff0;
          uVar15 = uVar4 + 0xf & 0xfffffff0;
          uVar17 = uVar13 * uVar15 * 3 >> 1;
          printf("%d %d %d %d %d",(ulong)uVar3,(ulong)uVar4,(ulong)uVar13,(ulong)uVar15,
                 (ulong)uVar17);
          lVar11 = ftell(__stream);
          lVar14 = (long)(int)local_98._0_4_;
          local_98._0_8_ = lVar14;
          if (lVar11 < lVar14) {
            local_58 = (size_t)uVar17;
            lVar11 = 0;
            do {
              lVar14 = lVar11;
              if (local_88.size == 0) {
                if (local_88.buf == (RK_U8 *)0x0) {
                  local_88.buf = (RK_U8 *)malloc(local_58);
LAB_00102247:
                  if (local_88.buf == (RK_U8 *)0x0) {
                    uVar7 = 0xffffff98;
                    goto LAB_00102372;
                  }
                  local_68 = CONCAT44(local_68._4_4_,uVar17);
                }
                else if ((uint)local_68 < uVar17) {
                  local_88.buf = (RK_U8 *)realloc(local_88.buf,local_58);
                  goto LAB_00102247;
                }
                RVar6 = readBytesFromFile(local_88.buf,uVar3 * uVar4 * 3 >> 1,(FILE *)__stream);
                if (RVar6 != 0) goto LAB_0010235a;
                local_88.size = uVar17;
                lVar14 = lVar11 + 40000;
                local_88.timeUs = lVar11;
                lVar12 = ftell(__stream);
                printf("read one frame, size: %d, timeUs: %lld, filePos: %ld\n",(ulong)uVar17,lVar11
                       ,lVar12);
              }
              uVar7 = (*ctx->encode)(ctx,&local_88,&local_50);
              if ((int)uVar7 < 0) {
                uVar7 = 0xffffff42;
                goto LAB_0010235a;
              }
              local_88._8_8_ = local_88._8_8_ & 0xffffffff00000000;
              printf("vpu encode one frame, out len: %d, left size: %d\n",
                     local_50._8_8_ & 0xffffffff,0);
              if ((local_50.size != 0) && (local_50.data != (RK_U8 *)0x0)) {
                if (__s != (FILE *)0x0) {
                  printf("dump %d bytes enc output stream to file\n");
                  fwrite(local_50.data,1,(long)local_50.size,__s);
                  fflush(__s);
                }
                local_50._8_8_ = local_50._8_8_ & 0xffffffff00000000;
              }
              usleep(3000);
              lVar12 = ftell(__stream);
              lVar11 = lVar14;
            } while (lVar12 < (long)local_98._0_8_);
          }
          puts("read end of file, complete");
        }
        else {
          printf("init vpu api context fail, ret: 0x%X\n",(ulong)uVar7);
          uVar7 = 0xffffff97;
        }
      }
LAB_0010235a:
      if (local_88.buf != (RK_U8 *)0x0) {
        free(local_88.buf);
        local_88.buf = (RK_U8 *)0x0;
      }
LAB_00102372:
      if (local_50.data != (RK_U8 *)0x0) {
        free(local_50.data);
        local_50.data = (RK_U8 *)0x0;
      }
      goto LAB_00101e8e;
    }
    pcVar16 = "input file not exsist";
  }
  puts(pcVar16);
  uVar7 = 0xffffff9b;
  __s = (FILE *)0x0;
  __stream = (FILE *)0x0;
LAB_00101e8e:
  if (ctx != (VpuCodecContext_t *)0x0) {
    if (ctx->private_data != (void *)0x0) {
      free(ctx->private_data);
      ctx->private_data = (void *)0x0;
    }
    (*vpuapi_close_ctx)(&ctx);
    ctx = (VpuCodecContext_t *)0x0;
  }
  if (__stream != (FILE *)0x0) {
    fclose(__stream);
  }
  if (__s != (FILE *)0x0) {
    fclose(__s);
  }
  if (uVar7 == 0) {
    puts("encode demo complete OK.");
    uVar7 = 0;
  }
  else {
    printf("encode demo fail, err: %d\n",(ulong)uVar7);
  }
  return uVar7;
}

Assistant:

static RK_S32 vpu_encode_demo(VpuApiDemoCmdContext_t *cmd)
{
    FILE *pInFile = NULL;
    FILE *pOutFile = NULL;
    RK_S32 nal = 0x00000001;
    RK_S32 fileSize;
    RK_S32 ret = 0;
    RK_S32 size;
    RK_U32 readOneFrameSize = 0;
    EncoderOut_t    enc_out_yuv;
    EncoderOut_t *enc_out = NULL;
    VpuApiEncInput enc_in_strm;
    VpuApiEncInput *api_enc_in = &enc_in_strm;
    EncInputStream_t *enc_in = NULL;
    EncParameter_t *enc_param = NULL;
    RK_S64 fakeTimeUs = 0;
    RK_U32 w_align = 0;
    RK_U32 h_align = 0;

    int Format = ENC_INPUT_YUV420_PLANAR;

    if (cmd == NULL) {
        return -1;
    }

    if ((cmd->have_input == 0) || (cmd->width <= 0) || (cmd->height <= 0)
        || (cmd->coding <= OMX_RK_VIDEO_CodingAutoDetect)) {
        printf("Warning: missing needed parameters for vpu api demo\n");
    }

    if (cmd->have_input) {
        printf("input bitstream w: %d, h: %d, coding: %d(%s), path: %s\n",
               cmd->width, cmd->height, cmd->coding,
               cmd->codec_type == CODEC_DECODER ? "decode" : "encode",
               cmd->input_file);

        pInFile = fopen(cmd->input_file, "rb");
        if (pInFile == NULL) {
            printf("input file not exsist\n");
            ENCODE_ERR_RET(ERROR_INVALID_PARAM);
        }
    } else {
        printf("please set input bitstream file\n");
        ENCODE_ERR_RET(ERROR_INVALID_PARAM);
    }

    if (cmd->have_output) {
        printf("vpu api demo output file: %s\n",
               cmd->output_file);
        pOutFile = fopen(cmd->output_file, "wb");
        if (pOutFile == NULL) {
            printf("can not write output file\n");
            ENCODE_ERR_RET(ERROR_INVALID_PARAM);
        }
    }

#ifdef FOR_TEST_ENCODE
    ctx = (struct VpuCodecContext *)malloc(sizeof(struct VpuCodecContext));
    if (!ctx) {
        printf("Input context has not been properly allocated");
        return -1;
    }
    memset(ctx, 0, sizeof(struct VpuCodecContext));

    ctx->videoCoding = OMX_RK_VIDEO_CodingAVC;
    ctx->codecType = CODEC_ENCODER;
    ctx->width  = cmd->width;
    ctx->height = cmd->height;
#endif

    fseek(pInFile, 0L, SEEK_END);
    fileSize = ftell(pInFile);
    fseek(pInFile, 0L, SEEK_SET);

    memset(&enc_in_strm, 0, sizeof(VpuApiEncInput));
    enc_in = &enc_in_strm.stream;
    enc_in->buf = NULL;

    memset(&enc_out_yuv, 0, sizeof(EncoderOut_t));
    enc_out = &enc_out_yuv;
    enc_out->data = (RK_U8 *)malloc(cmd->width * cmd->height);
    if (enc_out->data == NULL) {
        ENCODE_ERR_RET(ERROR_MEMORY);
    }

    ret = vpuapi_open_ctx(&ctx);
    if (ret || (ctx == NULL)) {
        ENCODE_ERR_RET(ERROR_MEMORY);
    }

    /*
     ** now init vpu api context. codecType, codingType, width ,height
     ** are all needed before init.
    */
    ctx->codecType = cmd->codec_type;
    ctx->videoCoding = cmd->coding;
    ctx->width = cmd->width;
    ctx->height = cmd->height;
    ctx->no_thread = 1;

    ctx->private_data = malloc(sizeof(EncParameter_t));
    memset(ctx->private_data, 0, sizeof(EncParameter_t));

    enc_param = (EncParameter_t *)ctx->private_data;
    enc_param->width        = cmd->width;
    enc_param->height       = cmd->height;
    enc_param->format       = ENC_INPUT_YUV420_PLANAR;
    enc_param->rc_mode      = 0;
    enc_param->bitRate      = 4000000;
    enc_param->framerate    = 25;
    enc_param->enableCabac  = 1;
    enc_param->cabacInitIdc = 0;
    enc_param->intraPicRate = 30;
    enc_param->profileIdc   = 100;
    enc_param->levelIdc     = 40;

    if ((ret = ctx->init(ctx, NULL, 0)) != 0) {
        printf("init vpu api context fail, ret: 0x%X\n", ret);
        ENCODE_ERR_RET(ERROR_INIT_VPU);
    }

    /*
     ** init of VpuCodecContext while running encode, it returns
     ** sps and pps of encoder output, you need to save sps and pps
     ** after init.
    */
    printf("encode init ok, sps len: %d\n", ctx->extradata_size);
    if (pOutFile && (ctx->extradata_size > 0)) {
        printf("dump %d bytes enc output stream to file\n",
               ctx->extradata_size);

        /* save sps and pps */
        fwrite(ctx->extradata, 1, ctx->extradata_size, pOutFile);
        fflush(pOutFile);
    }

    ret = ctx->control(ctx, VPU_API_ENC_SETFORMAT, &Format);
    if (ret)
        printf("VPU_API_ENC_SETFORMAT ret %d\n", ret);

    ret = ctx->control(ctx, VPU_API_ENC_GETCFG, enc_param);
    if (ret)
        printf("VPU_API_ENC_GETCFG ret %d\n", ret);

    enc_param->rc_mode = 1;

    ret = ctx->control(ctx, VPU_API_ENC_SETCFG, enc_param);
    if (ret)
        printf("VPU_API_ENC_SETCFG ret %d\n", ret);

    /*
     ** vpu api encode process.
    */
    printf("init vpu api context ok, input yuv stream file size: %d\n", fileSize);
    w_align = ((ctx->width + 15) & (~15));
    h_align = ((ctx->height + 15) & (~15));
    size = w_align * h_align * 3 / 2;
    readOneFrameSize = ctx->width * ctx->height * 3 / 2;
    printf("%d %d %d %d %d", ctx->width, ctx->height, w_align, h_align, size);
    nal = BSWAP32(nal);

    do {
        if (ftell(pInFile) >= fileSize) {
            printf("read end of file, complete\n");
            break;
        }

        if (enc_in && (enc_in->size == 0)) {
            if (enc_in->buf == NULL) {
                enc_in->buf = (RK_U8 *)(malloc)(size);
                if (enc_in->buf == NULL) {
                    ENCODE_ERR_RET(ERROR_MEMORY);
                }
                api_enc_in->capability = size;
            }

            if (api_enc_in->capability < ((RK_U32)size)) {
                enc_in->buf = (RK_U8 *)(realloc)((void *)(enc_in->buf), size);
                if (enc_in->buf == NULL) {
                    ENCODE_ERR_RET(ERROR_MEMORY);
                }
                api_enc_in->capability = size;
            }

            if (readBytesFromFile(enc_in->buf, readOneFrameSize, pInFile)) {
                break;
            } else {
                enc_in->size = size;
                enc_in->timeUs = fakeTimeUs;
                fakeTimeUs += 40000;
            }

            printf("read one frame, size: %d, timeUs: %lld, filePos: %ld\n",
                   enc_in->size, enc_in->timeUs, ftell(pInFile));
        }

        if ((ret = ctx->encode(ctx, enc_in, enc_out)) < 0) {
            ENCODE_ERR_RET(ERROR_VPU_DECODE);
        } else {
            enc_in->size = 0;  // TODO encode completely, and set enc_in->size to 0
            printf("vpu encode one frame, out len: %d, left size: %d\n",
                   enc_out->size, enc_in->size);

            /*
             ** encoder output stream is raw bitstream, you need to add nal
             ** head by yourself.
            */
            if ((enc_out->size) && (enc_out->data)) {
                if (pOutFile) {
                    printf("dump %d bytes enc output stream to file\n",
                           enc_out->size);
                    //fwrite((RK_U8*)&nal, 1, 4, pOutFile);  // because output stream have start code, so here mask this code
                    fwrite(enc_out->data, 1, enc_out->size, pOutFile);
                    fflush(pOutFile);
                }

                enc_out->size = 0;
            }
        }

        usleep(3000);
    } while (1);

ENCODE_OUT:
    if (enc_in && enc_in->buf) {
        free(enc_in->buf);
        enc_in->buf = NULL;
    }
    if (enc_out && (enc_out->data)) {
        free(enc_out->data);
        enc_out->data = NULL;
    }
    if (ctx) {
        if (ctx->private_data) {
            free(ctx->private_data);
            ctx->private_data = NULL;
        }
        vpuapi_close_ctx(&ctx);
        ctx = NULL;
    }
    if (pInFile) {
        fclose(pInFile);
        pInFile = NULL;
    }
    if (pOutFile) {
        fclose(pOutFile);
        pOutFile = NULL;
    }

    if (ret) {
        printf("encode demo fail, err: %d\n", ret);
    } else {
        printf("encode demo complete OK.\n");
    }
    return ret;

}